

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

uint8 GetFaceMask(S2ShapeIndex *index)

{
  ulong uVar1;
  long *in_RAX;
  byte bVar2;
  pointer *__ptr;
  Iterator it;
  long *local_28;
  
  bVar2 = 0;
  local_28 = in_RAX;
  (*index->_vptr_S2ShapeIndex[6])(&local_28,index,0);
  while( true ) {
    uVar1 = local_28[1];
    if (uVar1 == 0xffffffffffffffff) break;
    bVar2 = bVar2 | '\x01' << (byte)(uVar1 >> 0x3d);
    (**(code **)(*local_28 + 0x30))
              (local_28,(~(0xcfffffffffffffff - (uVar1 & 0xe000000000000000)) &
                        (uVar1 & 0xe000000000000000) + 0x2fffffffffffffff) + 1);
  }
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return bVar2;
}

Assistant:

uint8 GetFaceMask(const S2ShapeIndex& index) {
  uint8 mask = 0;
  S2ShapeIndex::Iterator it(&index, S2ShapeIndex::BEGIN);
  while (!it.done()) {
    int face = it.id().face();
    mask |= 1 << face;
    it.Seek(S2CellId::FromFace(face + 1).range_min());
  }
  return mask;
}